

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::GenStruct(RustGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  IdlNamer *pIVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  Value *pVVar4;
  char *__s;
  string *this_01;
  allocator<char> local_c19;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if ((((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c18,"private",(allocator<char> *)&local_bf0);
    pVVar4 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(struct_def->super_Definition).attributes,&local_c18);
    __s = "pub(crate)";
    if (pVVar4 == (Value *)0x0) {
      __s = "pub";
    }
    std::__cxx11::string::~string((string *)&local_c18);
  }
  else {
    __s = "pub";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"ACCESS_TYPE",&local_c19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf0,__s,&local_bf1);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_c18,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_c18);
  GenComment(this,&(struct_def->super_Definition).doc_comment,"");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"ALIGN",&local_c19);
  NumToString<unsigned_long>(&local_bf0,struct_def->minalign);
  CodeWriter::SetValue(this_00,&local_c18,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"STRUCT_TY",&local_c19);
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_bf0,pIVar1,struct_def);
  CodeWriter::SetValue(this_00,&local_c18,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"STRUCT_SIZE",&local_c19);
  NumToString<unsigned_long>(&local_bf0,struct_def->bytesize);
  CodeWriter::SetValue(this_00,&local_c18,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"// struct {{STRUCT_TY}}, aligned to {{ALIGN}}",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"#[repr(transparent)]",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"#[derive(Clone, Copy, PartialEq)]",(allocator<char> *)&local_c18)
  ;
  CodeWriter::operator+=(this_00,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"{{ACCESS_TYPE}} struct {{STRUCT_TY}}(pub [u8; {{STRUCT_SIZE}}]);"
             ,(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"impl Default for {{STRUCT_TY}} { ",(allocator<char> *)&local_c18)
  ;
  CodeWriter::operator+=(this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"  fn default() -> Self { ",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"    Self([0; {{STRUCT_SIZE}}])",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"  }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"impl core::fmt::Debug for {{STRUCT_TY}} {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"    f.debug_struct(\"{{STRUCT_TY}}\")",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2670:36)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2670:36)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"      .finish()",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"  }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"impl flatbuffers::SimpleToVerifyInSlice for {{STRUCT_TY}} {}",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"impl<\'a> flatbuffers::Follow<\'a> for {{STRUCT_TY}} {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"  type Inner = &\'a {{STRUCT_TY}};",(allocator<char> *)&local_c18
            );
  CodeWriter::operator+=(this_00,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"  #[inline]",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"    <&\'a {{STRUCT_TY}}>::follow(buf, loc)",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"  }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"impl<\'a> flatbuffers::Follow<\'a> for &\'a {{STRUCT_TY}} {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"  type Inner = &\'a {{STRUCT_TY}};",(allocator<char> *)&local_c18
            );
  CodeWriter::operator+=(this_00,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"  #[inline]",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"    flatbuffers::follow_cast_ref::<{{STRUCT_TY}}>(buf, loc)",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"  }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"impl<\'b> flatbuffers::Push for {{STRUCT_TY}} {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"    type Output = {{STRUCT_TY}};",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"    #[inline]",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {"
             ,(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,
             "        let src = ::core::slice::from_raw_parts(self as *const {{STRUCT_TY}} as *const u8, Self::size());"
             ,(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"        dst.copy_from_slice(src);",(allocator<char> *)&local_c18)
  ;
  CodeWriter::operator+=(this_00,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"    }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"impl<\'a> flatbuffers::Verifiable for {{STRUCT_TY}} {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"  #[inline]",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"  fn run_verifier(",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"    v: &mut flatbuffers::Verifier, pos: usize",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_6d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"    use self::flatbuffers::Verifiable;",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"    v.in_buffer::<Self>(pos)",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"  }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"NUM_FIELDS",&local_c19)
    ;
    NumToString<unsigned_long>(&local_bf0,(long)ppFVar3 - (long)ppFVar2 >> 3);
    CodeWriter::SetValue(this_00,&local_c18,&local_bf0);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::__cxx11::string::~string((string *)&local_c18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_790,"impl Serialize for {{STRUCT_TY}} {",
               (allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,
               "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>",
               (allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d0,"  where",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_7d0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"    S: Serializer,",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_7f0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"  {",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    if (ppFVar3 == ppFVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_830,
                 "    let s = serializer.serialize_struct(\"{{STRUCT_TY}}\", 0)?;",
                 (allocator<char> *)&local_c18);
      CodeWriter::operator+=(this_00,&local_830);
      this_01 = &local_830;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,
                 "    let mut s = serializer.serialize_struct(\"{{STRUCT_TY}}\", {{NUM_FIELDS}})?;",
                 (allocator<char> *)&local_c18);
      CodeWriter::operator+=(this_00,&local_850);
      this_01 = &local_850;
    }
    std::__cxx11::string::~string((string *)this_01);
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2740:38)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2740:38)>
               ::_M_manager;
    local_70._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_70);
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"    s.end()",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_890,"  }",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_890);
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b0,"}",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,"",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"impl<\'a> {{STRUCT_TY}} {",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"  #[allow(clippy::too_many_arguments)]",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_910);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_930,"  pub fn new(",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2756:36)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2756:36)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"  ) -> Self {",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_970,"    let mut s = Self([0; {{STRUCT_SIZE}}]);",
             (allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2762:36)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2762:36)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"    s",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"  }",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,"",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  if ((((this->super_BaseGenerator).parser_)->opts).generate_name_strings == true) {
    GenFullyQualifiedNameGetter(this,struct_def,(string *)struct_def);
  }
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2775:36)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2775:36)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c18,"STRUCT_OTY",&local_c19)
    ;
    (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_bf0,pIVar1,struct_def);
    CodeWriter::SetValue(this_00,&local_c18,&local_bf0);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::__cxx11::string::~string((string *)&local_c18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f0,"  pub fn unpack(&self) -> {{STRUCT_OTY}} {",
               (allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_9f0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,"    {{STRUCT_OTY}} {",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_a10);
    std::__cxx11::string::~string((string *)&local_a10);
    local_f0._8_8_ = 0;
    local_d8 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2886:38)>
               ::_M_invoke;
    local_e0 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2886:38)>
               ::_M_manager;
    local_f0._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_f0);
    std::_Function_base::~_Function_base((_Function_base *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"    }",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a50,"  }",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_a50);
    std::__cxx11::string::~string((string *)&local_a50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a70,"}",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_a70);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a90,"",(allocator<char> *)&local_c18);
  CodeWriter::operator+=(this_00,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"#[derive(Debug, Clone, PartialEq, Default)]",
               (allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_ab0);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ad0,"{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {",
               (allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    local_110._8_8_ = 0;
    local_f8 = std::
               _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2913:38)>
               ::_M_invoke;
    local_100 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2913:38)>
                ::_M_manager;
    local_110._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_110)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"}",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_af0);
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b10,"impl {{STRUCT_OTY}} {",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b30,"  pub fn pack(&self) -> {{STRUCT_TY}} {",
               (allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_b30);
    std::__cxx11::string::~string((string *)&local_b30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b50,"    {{STRUCT_TY}}::new(",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_b50);
    std::__cxx11::string::~string((string *)&local_b50);
    local_130._8_8_ = 0;
    local_118 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2923:38)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:2923:38)>
                ::_M_manager;
    local_130._M_unused._M_object = this;
    ForAllStructFields(this,struct_def,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_130)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b70,"    )",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_b70);
    std::__cxx11::string::~string((string *)&local_b70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b90,"  }",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_b90);
    std::__cxx11::string::~string((string *)&local_b90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb0,"}",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"",(allocator<char> *)&local_c18);
    CodeWriter::operator+=(this_00,&local_bd0);
    std::__cxx11::string::~string((string *)&local_bd0);
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def) {
    const bool is_private =
        parser_.opts.no_leak_private_annotations &&
        (struct_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    // Generates manual padding and alignment.
    // Variables are private because they contain little endian data on all
    // platforms.
    GenComment(struct_def.doc_comment);
    code_.SetValue("ALIGN", NumToString(struct_def.minalign));
    code_.SetValue("STRUCT_TY", namer_.Type(struct_def));
    code_.SetValue("STRUCT_SIZE", NumToString(struct_def.bytesize));

    // We represent Flatbuffers-structs in Rust-u8-arrays since the data may be
    // of the wrong endianness and alignment 1.
    //
    // PartialEq is useful to derive because we can correctly compare structs
    // for equality by just comparing their underlying byte data. This doesn't
    // hold for PartialOrd/Ord.
    code_ += "// struct {{STRUCT_TY}}, aligned to {{ALIGN}}";
    code_ += "#[repr(transparent)]";
    code_ += "#[derive(Clone, Copy, PartialEq)]";
    code_ += "{{ACCESS_TYPE}} struct {{STRUCT_TY}}(pub [u8; {{STRUCT_SIZE}}]);";
    code_ += "impl Default for {{STRUCT_TY}} { ";
    code_ += "  fn default() -> Self { ";
    code_ += "    Self([0; {{STRUCT_SIZE}}])";
    code_ += "  }";
    code_ += "}";

    // Debug for structs.
    code_ += "impl core::fmt::Debug for {{STRUCT_TY}} {";
    code_ +=
        "  fn fmt(&self, f: &mut core::fmt::Formatter"
        ") -> core::fmt::Result {";
    code_ += "    f.debug_struct(\"{{STRUCT_TY}}\")";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "    .field(\"{{FIELD}}\", &self.{{FIELD}}())";
    });
    code_ += "      .finish()";
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate impls for SafeSliceAccess (because all structs are endian-safe),
    // Follow for the value type, Follow for the reference type, Push for the
    // value type, and Push for the reference type.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{STRUCT_TY}} {}";
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{STRUCT_TY}} {";
    code_ += "  type Inner = &'a {{STRUCT_TY}};";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ += "    <&'a {{STRUCT_TY}}>::follow(buf, loc)";
    code_ += "  }";
    code_ += "}";
    code_ += "impl<'a> flatbuffers::Follow<'a> for &'a {{STRUCT_TY}} {";
    code_ += "  type Inner = &'a {{STRUCT_TY}};";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ += "    flatbuffers::follow_cast_ref::<{{STRUCT_TY}}>(buf, loc)";
    code_ += "  }";
    code_ += "}";
    code_ += "impl<'b> flatbuffers::Push for {{STRUCT_TY}} {";
    code_ += "    type Output = {{STRUCT_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        let src = ::core::slice::from_raw_parts(self as *const "
        "{{STRUCT_TY}} as *const u8, Self::size());";
    code_ += "        dst.copy_from_slice(src);";
    code_ += "    }";
    code_ += "}";
    code_ += "";

    // Generate verifier: Structs are simple so presence and alignment are
    // all that need to be checked.
    code_ += "impl<'a> flatbuffers::Verifiable for {{STRUCT_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    v.in_buffer::<Self>(pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      const auto numFields = struct_def.fields.vec.size();
      code_.SetValue("NUM_FIELDS", NumToString(numFields));
      code_ += "impl Serialize for {{STRUCT_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (numFields == 0) {
        code_ +=
            "    let s = serializer.serialize_struct(\"{{STRUCT_TY}}\", 0)?;";
      } else {
        code_ +=
            "    let mut s = serializer.serialize_struct(\"{{STRUCT_TY}}\", "
            "{{NUM_FIELDS}})?;";
      }
      ForAllStructFields(struct_def, [&](const FieldDef &unused) {
        (void)unused;
        code_ +=
            "    s.serialize_field(\"{{FIELD}}\", "
            "&self.{{FIELD}}())?;";
      });
      code_ += "    s.end()";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate a constructor that takes all fields as arguments.
    code_ += "impl<'a> {{STRUCT_TY}} {";
    code_ += "  #[allow(clippy::too_many_arguments)]";
    code_ += "  pub fn new(";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "  {{FIELD}}: {{REF}}{{FIELD_TYPE}},";
    });
    code_ += "  ) -> Self {";
    code_ += "    let mut s = Self([0; {{STRUCT_SIZE}}]);";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "  s.set_{{FIELD}}({{FIELD}});";
    });
    code_ += "    s";
    code_ += "  }";
    code_ += "";

    if (parser_.opts.generate_name_strings) {
      GenFullyQualifiedNameGetter(struct_def, struct_def.name);
    }

    // Generate accessor methods for the struct.
    ForAllStructFields(struct_def, [&](const FieldDef &field) {
      this->GenComment(field.doc_comment);
      // Getter.
      if (IsStruct(field.value.type)) {
        code_ += "pub fn {{FIELD}}(&self) -> &{{FIELD_TYPE}} {";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid struct in this slot";
        code_ +=
            "  unsafe {"
            " &*(self.0[{{FIELD_OFFSET}}..].as_ptr() as *const"
            " {{FIELD_TYPE}}) }";
      } else if (IsArray(field.value.type)) {
        code_.SetValue("ARRAY_SIZE",
                       NumToString(field.value.type.fixed_length));
        code_.SetValue("ARRAY_ITEM", GetTypeGet(field.value.type.VectorType()));
        code_ +=
            "pub fn {{FIELD}}(&'a self) -> "
            "flatbuffers::Array<'a, {{ARRAY_ITEM}}, {{ARRAY_SIZE}}> {";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid array in this slot";
        code_ +=
            "  unsafe { flatbuffers::Array::follow(&self.0, {{FIELD_OFFSET}}) "
            "}";
      } else {
        code_ += "pub fn {{FIELD}}(&self) -> {{FIELD_TYPE}} {";
        code_ +=
            "  let mut mem = core::mem::MaybeUninit::"
            "<<{{FIELD_TYPE}} as EndianScalar>::Scalar>::uninit();";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid value in this slot";
        code_ += "  EndianScalar::from_little_endian(unsafe {";
        code_ += "    core::ptr::copy_nonoverlapping(";
        code_ += "      self.0[{{FIELD_OFFSET}}..].as_ptr(),";
        code_ += "      mem.as_mut_ptr() as *mut u8,";
        code_ +=
            "      core::mem::size_of::<<{{FIELD_TYPE}} as "
            "EndianScalar>::Scalar>(),";
        code_ += "    );";
        code_ += "    mem.assume_init()";
        code_ += "  })";
      }
      code_ += "}\n";
      // Setter.
      if (IsStruct(field.value.type)) {
        code_.SetValue("FIELD_SIZE", NumToString(InlineSize(field.value.type)));
        code_ += "#[allow(clippy::identity_op)]";  // If FIELD_OFFSET=0.
        code_ += "pub fn set_{{FIELD}}(&mut self, x: &{{FIELD_TYPE}}) {";
        code_ +=
            "  self.0[{{FIELD_OFFSET}}..{{FIELD_OFFSET}} + {{FIELD_SIZE}}]"
            ".copy_from_slice(&x.0)";
      } else if (IsArray(field.value.type)) {
        if (GetFullType(field.value.type) == ftArrayOfBuiltin) {
          code_.SetValue("ARRAY_ITEM",
                         GetTypeGet(field.value.type.VectorType()));
          code_.SetValue(
              "ARRAY_ITEM_SIZE",
              NumToString(InlineSize(field.value.type.VectorType())));
          code_ +=
              "pub fn set_{{FIELD}}(&mut self, items: &{{FIELD_TYPE}}) "
              "{";
          code_ += "  // Safety:";
          code_ += "  // Created from a valid Table for this object";
          code_ += "  // Which contains a valid array in this slot";
          code_ +=
              "  unsafe { flatbuffers::emplace_scalar_array(&mut self.0, "
              "{{FIELD_OFFSET}}, items) };";
        } else {
          code_.SetValue("FIELD_SIZE",
                         NumToString(InlineSize(field.value.type)));
          code_ += "pub fn set_{{FIELD}}(&mut self, x: &{{FIELD_TYPE}}) {";
          code_ += "  // Safety:";
          code_ += "  // Created from a valid Table for this object";
          code_ += "  // Which contains a valid array in this slot";
          code_ += "  unsafe {";
          code_ += "    core::ptr::copy(";
          code_ += "      x.as_ptr() as *const u8,";
          code_ += "      self.0.as_mut_ptr().add({{FIELD_OFFSET}}),";
          code_ += "      {{FIELD_SIZE}},";
          code_ += "    );";
          code_ += "  }";
        }
      } else {
        code_ += "pub fn set_{{FIELD}}(&mut self, x: {{FIELD_TYPE}}) {";
        code_ += "  let x_le = x.to_little_endian();";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid value in this slot";
        code_ += "  unsafe {";
        code_ += "    core::ptr::copy_nonoverlapping(";
        code_ += "      &x_le as *const _ as *const u8,";
        code_ += "      self.0[{{FIELD_OFFSET}}..].as_mut_ptr(),";
        code_ +=
            "      core::mem::size_of::<<{{FIELD_TYPE}} as "
            "EndianScalar>::Scalar>(),";
        code_ += "    );";
        code_ += "  }";
      }
      code_ += "}\n";

      // Generate a comparison function for this field if it is a key.
      if (field.key) { GenKeyFieldMethods(field); }
    });

    // Generate Object API unpack method.
    if (parser_.opts.generate_object_based_api) {
      code_.SetValue("STRUCT_OTY", namer_.ObjectType(struct_def));
      code_ += "  pub fn unpack(&self) -> {{STRUCT_OTY}} {";
      code_ += "    {{STRUCT_OTY}} {";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        if (IsArray(field.value.type)) {
          if (GetFullType(field.value.type) == ftArrayOfStruct) {
            code_ +=
                "    {{FIELD}}: { let {{FIELD}} = "
                "self.{{FIELD}}(); flatbuffers::array_init(|i| "
                "{{FIELD}}.get(i).unpack()) },";
          } else {
            code_ += "    {{FIELD}}: self.{{FIELD}}().into(),";
          }
        } else {
          std::string unpack = IsStruct(field.value.type) ? ".unpack()" : "";
          code_ += "    {{FIELD}}: self.{{FIELD}}()" + unpack + ",";
        }
      });
      code_ += "    }";
      code_ += "  }";
    }

    code_ += "}";  // End impl Struct methods.
    code_ += "";

    // Generate Struct Object.
    if (parser_.opts.generate_object_based_api) {
      // Struct declaration
      code_ += "#[derive(Debug, Clone, PartialEq, Default)]";
      code_ += "{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        (void)field;  // unused.
        code_ += "pub {{FIELD}}: {{FIELD_OTY}},";
      });
      code_ += "}";
      // The `pack` method that turns the native struct into its Flatbuffers
      // counterpart.
      code_ += "impl {{STRUCT_OTY}} {";
      code_ += "  pub fn pack(&self) -> {{STRUCT_TY}} {";
      code_ += "    {{STRUCT_TY}}::new(";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        if (IsStruct(field.value.type)) {
          code_ += "    &self.{{FIELD}}.pack(),";
        } else if (IsArray(field.value.type)) {
          if (GetFullType(field.value.type) == ftArrayOfStruct) {
            code_ +=
                "    &flatbuffers::array_init(|i| "
                "self.{{FIELD}}[i].pack()),";
          } else {
            code_ += "    &self.{{FIELD}},";
          }
        } else {
          code_ += "    self.{{FIELD}},";
        }
      });
      code_ += "    )";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }
  }